

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void printS16ImmOperand(MCInst *MI,int OpNum,SStream *O)

{
  cs_detail *pcVar1;
  short sVar2;
  MCOperand *op;
  int64_t iVar3;
  uint8_t *puVar4;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  int16_t Value;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar3 = MCOperand_getImm(op);
  sVar2 = (short)iVar3;
  if (sVar2 < 0) {
    if (sVar2 < -9) {
      SStream_concat(in_RDX,"-0x%x",(ulong)(uint)-(int)sVar2);
    }
    else {
      SStream_concat(in_RDX,"-%u",(ulong)(uint)-(int)sVar2);
    }
  }
  else if (sVar2 < 10) {
    SStream_concat(in_RDX,"%u",(ulong)(uint)(int)sVar2);
  }
  else {
    SStream_concat(in_RDX,"0x%x",(ulong)(uint)(int)sVar2);
  }
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar4 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x15;
    puVar4[0] = '\x02';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    *(long *)(in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x1d) = (long)sVar2;
    pcVar1 = in_RDI->flat_insn->detail;
    (pcVar1->field_6).x86.opcode[0] = (pcVar1->field_6).x86.opcode[0] + '\x01';
  }
  return;
}

Assistant:

static void printS16ImmOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	if (MCOperand_isImm(MCInst_getOperand(MI, OpNo))) {
		unsigned short Imm = (unsigned short)MCOperand_getImm(MCInst_getOperand(MI, OpNo));
        if (Imm > HEX_THRESHOLD)
            SStream_concat(O, "0x%x", Imm);
        else
            SStream_concat(O, "%u", Imm);

		if (MI->csh->detail) {
			MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_IMM;
			MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].imm = Imm;
			MI->flat_insn->detail->ppc.op_count++;
		}
	} else
		printOperand(MI, OpNo, O);
}